

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ParserResult * __thiscall Catch::clara::detail::BoundFlagRef::setFlag(BoundFlagRef *this,bool flag)

{
  ParserResult *in_RDI;
  
  *this->m_ref = flag;
  *(undefined8 *)
   &(in_RDI->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.m_type =
       0;
  (in_RDI->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_0019a958;
  (in_RDI->m_errorMessage)._M_dataplus._M_p = (pointer)&(in_RDI->m_errorMessage).field_2;
  (in_RDI->m_errorMessage)._M_string_length = 0;
  (in_RDI->m_errorMessage).field_2._M_local_buf[0] = '\0';
  return in_RDI;
}

Assistant:

auto setFlag( bool flag ) -> ParserResult override {
            m_ref = flag;
            return ParserResult::ok( ParseResultType::Matched );
        }